

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

CPAccessResult pmreg_access_swinc(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  uint uVar1;
  CPAccessResult CVar2;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 0x1b & 1) != 0) {
    if ((uVar1 >> 9 & 1) == 0) {
      if (env->aarch64 == 0) {
        if ((env->uncached_cpsr & 0x1f) == 0x10) {
          uVar1 = 0;
        }
        else {
          uVar1 = 1;
        }
      }
      else {
        uVar1 = env->pstate >> 2 & 3;
      }
    }
    else {
      uVar1 = 1;
      if ((env->v7m).exception == 0) {
        uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
      }
    }
    if ((uVar1 == 0) && (((byte)(env->cp15).c9_pmuserenr >> 1 & !isread) != 0)) {
      return CP_ACCESS_OK;
    }
  }
  CVar2 = pmreg_access(env,ri,false);
  return CVar2;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}